

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_util.hpp
# Opt level: O3

person * __thiscall
rest_rpc::get_result<person>(person *__return_storage_ptr__,rest_rpc *this,string_view result)

{
  pointer *__ptr;
  tuple<int,_person> tp;
  undefined1 local_68 [24];
  _Head_base<0UL,_msgpack::v1::zone_*,_false> local_50;
  tuple<int,_person> local_48;
  
  local_68._0_4_ = NIL;
  local_50._M_head_impl = (zone *)0x0;
  rpc_service::msgpack_codec::unpack<std::tuple<int,person>>
            (&local_48,(msgpack_codec *)local_68,(char *)this,(size_t)result.data_);
  __return_storage_ptr__->id =
       local_48.super__Tuple_impl<0UL,_int,_person>.super__Tuple_impl<1UL,_person>.
       super__Head_base<1UL,_person,_false>._M_head_impl.id;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->name,
             local_48.super__Tuple_impl<0UL,_int,_person>.super__Tuple_impl<1UL,_person>.
             super__Head_base<1UL,_person,_false>._M_head_impl.name._M_dataplus._M_p,
             local_48.super__Tuple_impl<0UL,_int,_person>.super__Tuple_impl<1UL,_person>.
             super__Head_base<1UL,_person,_false>._M_head_impl.name._M_dataplus._M_p +
             local_48.super__Tuple_impl<0UL,_int,_person>.super__Tuple_impl<1UL,_person>.
             super__Head_base<1UL,_person,_false>._M_head_impl.name._M_string_length);
  __return_storage_ptr__->age =
       local_48.super__Tuple_impl<0UL,_int,_person>.super__Tuple_impl<1UL,_person>.
       super__Head_base<1UL,_person,_false>._M_head_impl.age;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.super__Tuple_impl<0UL,_int,_person>.super__Tuple_impl<1UL,_person>.
         super__Head_base<1UL,_person,_false>._M_head_impl.name._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_48.super__Tuple_impl<0UL,_int,_person>.super__Tuple_impl<1UL,_person>.
                 super__Head_base<1UL,_person,_false>._M_head_impl.name + 0x10U)) {
    operator_delete(local_48.super__Tuple_impl<0UL,_int,_person>.super__Tuple_impl<1UL,_person>.
                    super__Head_base<1UL,_person,_false>._M_head_impl.name._M_dataplus._M_p);
  }
  if (local_50._M_head_impl != (zone *)0x0) {
    std::default_delete<msgpack::v1::zone>::operator()
              ((default_delete<msgpack::v1::zone> *)&local_50,local_50._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

inline T get_result(string_view result) {
  rpc_service::msgpack_codec codec;
  auto tp = codec.unpack<std::tuple<int, T>>(result.data(), result.size());
  return std::get<1>(tp);
}